

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<float>::Print(TPZMatrix<float> *this,char *name,ostream *out,MatrixOutputFormat form)

{
  bool bVar1;
  _Setprecision _Var2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  ostream *poVar6;
  void *pvVar7;
  int in_ECX;
  ostream *in_RDX;
  char *in_RSI;
  TPZBaseMatrix *in_RDI;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float a;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float val_4;
  int64_t col_7;
  int64_t colmax_1;
  int64_t row_7;
  float val_3;
  int64_t col_6;
  int64_t colmax;
  int64_t row_6;
  int64_t nrow;
  int64_t numzero;
  bool sym;
  int64_t col_5;
  int64_t row_5;
  float val_2;
  int64_t col_4;
  int64_t row_4;
  float val_1;
  int64_t col_3;
  int64_t row_3;
  float val;
  int64_t col_2;
  int64_t row_2;
  int64_t col_1;
  int64_t row_1;
  anon_class_4_1_2f8713ba PrintVal;
  int columnlength;
  float value;
  int64_t col;
  int64_t row;
  int64_t ncols;
  int64_t nrows;
  ios cout_state;
  undefined8 in_stack_fffffffffffffc80;
  ostream *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  long local_220;
  long local_218;
  long local_210;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e0;
  long local_1d0;
  long local_1c8;
  long local_1b8;
  long local_1b0;
  long local_1a0;
  long local_198;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_158;
  long local_150;
  ios local_128 [268];
  int local_1c;
  ostream *local_18;
  char *local_10;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::ios::ios(local_128,(streambuf *)0x0);
  std::ios::copyfmt(local_128);
  poVar6 = local_18;
  _Var2 = std::setprecision(9);
  std::operator<<(poVar6,_Var2);
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  iVar5 = TPZBaseMatrix::Cols(in_RDI);
  if (local_1c == 0) {
    std::operator<<(local_18,"Writing matrix \'");
    if (local_10 != (char *)0x0) {
      std::operator<<(local_18,local_10);
    }
    poVar6 = std::operator<<(local_18,"\' (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
    poVar6 = std::operator<<(poVar6," x ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
    std::operator<<(poVar6,"):\n");
    for (local_150 = 0; local_150 < iVar4; local_150 = local_150 + 1) {
      std::operator<<(local_18,"\t");
      for (local_158 = 0; poVar6 = local_18, local_158 < iVar5; local_158 = local_158 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_150,local_158);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,extraout_XMM0_Da);
        std::operator<<(poVar6,"  ");
      }
      std::operator<<(local_18,"\n");
    }
    std::operator<<(local_18,"\n");
  }
  else if (local_1c == 6) {
    std::operator<<(local_18,"Writing matrix \'");
    if (local_10 != (char *)0x0) {
      std::operator<<(local_18,local_10);
    }
    poVar6 = std::operator<<(local_18,"\' (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
    poVar6 = std::operator<<(poVar6," x ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
    std::operator<<(poVar6,"):\n");
    for (local_170 = 0; local_170 < iVar4; local_170 = local_170 + 1) {
      for (local_178 = 0; local_178 < iVar5; local_178 = local_178 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_170,local_178);
        Print::anon_class_4_1_2f8713ba::operator()
                  ((anon_class_4_1_2f8713ba *)
                   CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                   in_stack_fffffffffffffc88,
                   (type_conflict)((ulong)in_stack_fffffffffffffc80 >> 0x20));
      }
      std::operator<<(local_18,"\n");
    }
    std::operator<<(local_18,"\n");
  }
  else if (local_1c == 1) {
    poVar6 = (ostream *)std::ostream::operator<<(local_18,iVar4);
    poVar6 = std::operator<<(poVar6," ");
    pvVar7 = (void *)std::ostream::operator<<(poVar6,iVar5);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    for (local_180 = 0; local_180 < iVar4; local_180 = local_180 + 1) {
      for (local_188 = 0; local_188 < iVar5; local_188 = local_188 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_180,local_188);
        if ((extraout_XMM0_Da_00 != 0.0) || (NAN(extraout_XMM0_Da_00))) {
          poVar6 = (ostream *)std::ostream::operator<<(local_18,local_180);
          poVar6 = std::operator<<(poVar6,' ');
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_188);
          poVar6 = std::operator<<(poVar6,' ');
          pvVar7 = (void *)std::ostream::operator<<(poVar6,extraout_XMM0_Da_00);
          std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    std::operator<<(local_18,"-1 -1 0.\n");
  }
  else if (local_1c == 2) {
    poVar6 = std::operator<<(local_18,local_10);
    std::operator<<(poVar6,"\n{ ");
    for (local_198 = 0; local_198 < iVar4; local_198 = local_198 + 1) {
      std::operator<<(local_18,"\n{ ");
      for (local_1a0 = 0; local_1a0 < iVar5; local_1a0 = local_1a0 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_198,local_1a0);
        std::ostream::operator<<(local_18,extraout_XMM0_Da_01);
        if (local_1a0 < iVar5 + -1) {
          std::operator<<(local_18,", ");
        }
        if ((local_1a0 + 1) % 6 == 0) {
          std::operator<<(local_18,'\n');
        }
      }
      std::operator<<(local_18," }");
      if (local_198 < iVar4 + -1) {
        std::operator<<(local_18,",");
      }
    }
    poVar6 = std::operator<<(local_18," };");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else if (local_1c == 5) {
    for (local_1b0 = 0; local_1b0 < iVar4; local_1b0 = local_1b0 + 1) {
      for (local_1b8 = 0; local_1b8 < iVar5; local_1b8 = local_1b8 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_1b0,local_1b8);
        std::ostream::operator<<(local_18,extraout_XMM0_Da_02);
        if (local_1b8 < iVar5 + -1) {
          std::operator<<(local_18," , ");
        }
      }
      if (local_1b0 < iVar4 + -1) {
        std::operator<<(local_18,"\n");
      }
    }
  }
  else if (local_1c == 3) {
    std::operator<<(local_18,local_10);
    for (local_1c8 = 0; local_1c8 < iVar4; local_1c8 = local_1c8 + 1) {
      std::operator<<(local_18,"\n|");
      for (local_1d0 = 0; local_1d0 < iVar5; local_1d0 = local_1d0 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_1c8,local_1d0);
        bVar1 = IsZero(a);
        if (bVar1) {
          std::operator<<(local_18,".");
        }
        else {
          std::operator<<(local_18,"#");
        }
      }
      std::operator<<(local_18,"|");
    }
    std::operator<<(local_18,"\n");
  }
  else if (local_1c == 4) {
    iVar3 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x10])();
    local_1e0 = 0;
    for (local_1f0 = 0; local_1f0 < iVar4; local_1f0 = local_1f0 + 1) {
      local_1f8 = iVar4;
      if (iVar3 != 0) {
        local_1f8 = local_1f0 + 1;
      }
      for (local_200 = 0; local_200 < local_1f8; local_200 = local_200 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_1f0,local_200);
        if ((extraout_XMM0_Da_03 != 0.0) || (NAN(extraout_XMM0_Da_03))) {
          local_1e0 = local_1e0 + 1;
        }
      }
    }
    poVar6 = std::operator<<(local_18,"%%");
    poVar6 = std::operator<<(poVar6,local_10);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = (ostream *)std::ostream::operator<<(local_18,iVar4);
    poVar6 = std::operator<<(poVar6,' ');
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
    poVar6 = std::operator<<(poVar6,' ');
    pvVar7 = (void *)std::ostream::operator<<(poVar6,local_1e0);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    for (local_210 = 0; local_210 < iVar4; local_210 = local_210 + 1) {
      local_218 = iVar4;
      if (iVar3 != 0) {
        local_218 = local_210 + 1;
      }
      for (local_220 = 0; local_220 < local_218; local_220 = local_220 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_210,local_220);
        if ((extraout_XMM0_Da_04 != 0.0) || (NAN(extraout_XMM0_Da_04))) {
          poVar6 = (ostream *)std::ostream::operator<<(local_18,local_210 + 1);
          poVar6 = std::operator<<(poVar6,' ');
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_220 + 1);
          poVar6 = std::operator<<(poVar6,' ');
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,extraout_XMM0_Da_04);
          std::operator<<(poVar6,'\n');
        }
      }
    }
  }
  std::ios::copyfmt((ios *)(local_18 + *(long *)(*(long *)local_18 + -0x18)));
  std::ios::~ios(local_128);
  return;
}

Assistant:

void TPZMatrix<TVar>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const {
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value) {
        out << name << std::endl;
        for (int64_t i = 0; i < fRow; i++) {
            for (int64_t j = 0; j < fCol; j++) {
                out << "i = " << i << " j = " << j << " val " << Get(i, j) << std::endl;
            }
        }
        return;
   
    }
    //getting current settings of std::ostream instance
    std::ios cout_state(nullptr);
    cout_state.copyfmt(out);

    typedef std::numeric_limits< RTVar > typlim;
    out << std::setprecision(typlim::max_digits10);

    const auto nrows = Rows();
    const auto ncols = Cols();
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
		
        for ( int64_t row = 0; row < nrows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < ncols; col++ ) {
                out << GetVal( row, col) << "  ";//complex numbers are (a,b)
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EFixedColumn) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
        TVar value;
        constexpr int columnlength = typlim::max_digits10;

        auto PrintVal = [columnlength](std::ostream &out, RTVar val){
            if(val<0.) {
                out << std::setw(columnlength+1) << std::left << val << " ";
            }else{
                out << " ";
                out << std::setw(columnlength)   << std::left << val << " ";
            }
        };
        
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                value = Get( row, col);
                if constexpr (std::is_same_v<RTVar,TVar>){
                    PrintVal(out,value);
                }else{
                    out<<"(";
                    PrintVal(out,value.real());
                    out<<",";
                    PrintVal(out,value.imag());
                    out<<")";
                }
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << nrows << " " << ncols << endl;
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                const TVar val = GetVal(row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
        {
            
            out << name << "\n{ ";
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n{ ";
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        out << val.real() << "+I"<<val.imag();
                    }
                    if(col < ncols-1)
                        out << ", ";
                    if((col+1) % 6 == 0) out << '\n';
                }
                out << " }";
                if(row < nrows-1)
                    out << ",";
            }
		
            out << " };"<<std::endl;
		
        }else if( form == ECSV)
        {
         
            for ( int64_t row = 0; row < nrows; row++) {
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        const auto signchar = val.imag() > 0 ? '+' : '-';
                        out << val.real() <<signchar<<std::fabs(val.imag())<<"j";
                    }
                    if(col < ncols-1)  out << " , ";
                }
                if(row < nrows-1)
                    out << "\n";
            }

        } else if( form == EMatlabNonZeros)
        {
            out << name;
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n|";
                for ( int64_t col = 0; col < ncols; col++ )
                    if(IsZero(GetVal(row, col)) ){
                        out << ".";
                    }else{
                        out << "#";
                    }
                out << "|";
            }
            out << "\n";
        }
    else if( form == EMatrixMarket)
        {
            bool sym = IsSymmetric();
            int64_t numzero = 0;
            int64_t nrow = nrows;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            numzero++;
                        }
                    }
            }
            out << "%%"<< name << std::endl;
            out << nrows << ' ' << ncols << ' ' << numzero << std::endl;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        const TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            out << row+1 << ' ' << col+1 << ' ' << val << '\n';
                        }
                    }
            }
        }
    //restore precision
    out.copyfmt(cout_state);
}